

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bte.h
# Opt level: O0

void __thiscall merlin::bte::~bte(bte *this)

{
  bte *this_local;
  
  (this->super_graphical_model)._vptr_graphical_model = (_func_int **)&PTR__bte_00297260;
  (this->super_algorithm)._vptr_algorithm = (_func_int **)&DAT_002972f8;
  std::
  map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  ::~map(&this->m_cluster2var);
  std::
  vector<std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>,_std::allocator<std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>_>_>
  ::~vector(&this->m_separators);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&this->m_edge_indeces);
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector(&this->m_schedule);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_backward);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_forward);
  my_set<unsigned_long>::~my_set(&this->m_roots);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&this->m_out);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&this->m_in);
  std::vector<merlin::variable_set,_std::allocator<merlin::variable_set>_>::~vector(&this->m_scopes)
  ;
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&this->m_originals);
  std::vector<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>::
  ~vector(&this->m_clusters);
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->m_types);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_query);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_best_config);
  std::vector<merlin::factor,_std::allocator<merlin::factor>_>::~vector(&this->m_beliefs);
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->m_var_types);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_parents);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&this->m_order);
  graphical_model::~graphical_model(&this->m_gmo);
  algorithm::~algorithm(&this->super_algorithm);
  graphical_model::~graphical_model(&this->super_graphical_model);
  return;
}

Assistant:

~bte() {}